

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_creator.cpp
# Opt level: O3

Graph * createRandomGraph(Graph *__return_storage_ptr__,unsigned_long verices,unsigned_long edges,
                         int cost_min,int cost_max)

{
  pointer psVar1;
  pointer psVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  Graph *pGVar5;
  Graph *pGVar6;
  int iVar7;
  value_type vVar8;
  type *ptVar9;
  long lVar10;
  graph_type *cg;
  EdgeIterator ei;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  pairlist;
  default_add_edge_visitor vis;
  Graph G;
  EdgeIterator ei_end;
  mt19937 gen;
  undefined8 uStack_b98;
  undefined1 local_b90;
  undefined7 uStack_b8f;
  undefined1 uStack_b88;
  undefined7 uStack_b87;
  byte bStack_b80;
  undefined8 *local_b78;
  value_type local_b70;
  undefined8 *local_b68;
  value_type local_b60;
  long local_b58;
  __normal_iterator<std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
  local_b48;
  __normal_iterator<std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
  _Stack_b40;
  long local_b38;
  Graph *local_b28;
  undefined1 *local_b20;
  undefined8 *local_b18;
  pair<boost::detail::adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,_boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_*,_std::vector<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>,_boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>_>,_boost::detail::adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,_boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_*,_std::vector<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>,_boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>_>_>
  local_b10;
  adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>
  local_a80;
  undefined8 local_a48;
  undefined1 local_a40;
  undefined7 uStack_a3f;
  undefined1 uStack_a38;
  undefined8 uStack_a37;
  undefined8 *local_a28;
  mersenne_twister_engine<unsigned_int,_32UL,_624UL,_397UL,_31UL,_2567483615U,_11UL,_4294967295U,_7UL,_2636928640U,_15UL,_4022730752U,_18UL,_1812433253U>
  local_9f8;
  
  boost::
  adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>
  ::adjacency_list(&local_a80,(no_property *)&local_9f8);
  uStack_b88 = 0;
  uStack_b87 = 0;
  bStack_b80 = 0;
  uStack_b98 = 0;
  local_b90 = 0;
  uStack_b8f = 0;
  uStack_a38 = 0;
  uStack_a37 = 0;
  local_a48 = 0;
  local_a40 = 0;
  uStack_a3f = 0;
  boost::random::
  mersenne_twister_engine<unsigned_int,_32UL,_624UL,_397UL,_31UL,_2567483615U,_11UL,_4294967295U,_7UL,_2636928640U,_15UL,_4022730752U,_18UL,_1812433253U>
  ::seed(&local_9f8,
         &boost::random::
          mersenne_twister_engine<unsigned_int,32ul,624ul,397ul,31ul,2567483615u,11ul,4294967295u,7ul,2636928640u,15ul,4022730752u,18ul,1812433253u>
          ::default_seed);
  boost::
  generate_random_graph1<boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>,boost::random::mersenne_twister_engine<unsigned_int,32ul,624ul,397ul,31ul,2567483615u,11ul,4294967295u,7ul,2636928640u,15ul,4022730752u,18ul,1812433253u>>
            (&local_a80,verices,edges,&local_9f8,false,false);
  boost::
  make_connected<boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>,boost::vec_adj_list_vertex_id_map<boost::no_property,unsigned_long>,boost::default_add_edge_visitor>
            (&local_a80,&local_b10);
  local_b10.first.vEnd.m_value =
       (long)local_a80.super_type.m_vertices.
             super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)local_a80.super_type.m_vertices.
             super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
             ._M_impl.super__Vector_impl_data._M_start >> 5;
  local_b48._M_current = (pair<unsigned_long,_unsigned_long> *)0x0;
  _Stack_b40._M_current = (pair<unsigned_long,_unsigned_long> *)0x0;
  local_b38 = 0;
  if (local_a80.super_type.m_vertices.
      super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_a80.super_type.m_vertices.
      super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    vVar8 = 0;
  }
  else {
    ptVar9 = (type *)&((local_a80.super_type.m_vertices.
                        super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                        ._M_impl.super__Vector_impl_data._M_start)->super_StoredVertex).m_out_edges.
                      super__Vector_base<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
    local_b10.first.vCurr.m_value = 0;
    do {
      if (*ptVar9 != (type)((_Vector_impl_data *)(ptVar9 + -1))->_M_start) {
        local_b10.first.edges.super_type.m_initialized = true;
        local_b10.first.edges.super_type.m_storage.dummy_.aligner_ =
             (type)((_Vector_impl_data *)(ptVar9 + -1))->_M_start;
        local_b10.first.edges.super_type.m_storage.dummy_._8_8_ = local_b10.first.vCurr.m_value;
        local_b10.first.edges.super_type.m_storage.dummy_._16_8_ = *ptVar9;
        local_b10.first.edges.super_type.m_storage.dummy_._24_8_ = local_b10.first.vCurr.m_value;
        goto LAB_0010c621;
      }
      local_b10.first.vCurr.m_value = local_b10.first.vCurr.m_value + 1;
      ptVar9 = ptVar9 + 4;
      vVar8 = local_b10.first.vEnd.m_value;
    } while (local_b10.first.vEnd.m_value != local_b10.first.vCurr.m_value);
  }
  local_b10.first.edges.super_type.m_initialized = false;
  local_b10.first.vCurr.m_value = vVar8;
LAB_0010c621:
  local_b10.first.vBegin.m_value = 0;
  local_b10.second.vBegin.m_value = 0;
  local_b10.second.edges.super_type.m_initialized = false;
  local_b18 = &local_a48;
  local_b28 = __return_storage_ptr__;
  local_b20 = (undefined1 *)&uStack_b98;
  local_b10.first.m_g = &local_a80;
  local_b10.second.vCurr.m_value = local_b10.first.vEnd.m_value;
  local_b10.second.vEnd.m_value = local_b10.first.vEnd.m_value;
  local_b10.second.m_g = &local_a80;
  boost::tuples::
  tuple<boost::detail::adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>*,std::vector<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>,std::allocator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>>>>,unsigned_long,boost::detail::edge_desc_impl<boost::directed_tag,unsigned_long>,long>,boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>>&,boost::detail::adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>*,std::vector<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>,std::allocator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>>>>,unsigned_long,boost::detail::edge_desc_impl<boost::directed_tag,unsigned_long>,long>,boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>>&,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>
  ::operator=((tuple<boost::detail::adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>*,std::vector<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>,std::allocator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>>>>,unsigned_long,boost::detail::edge_desc_impl<boost::directed_tag,unsigned_long>,long>,boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>>&,boost::detail::adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>*,std::vector<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>,std::allocator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>>>>,unsigned_long,boost::detail::edge_desc_impl<boost::directed_tag,unsigned_long>,long>,boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>>&,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>
               *)&local_b20,&local_b10);
LAB_0010c67b:
  do {
    pGVar6 = local_b28;
    if (CONCAT71(uStack_b8f,local_b90) == CONCAT71(uStack_a3f,local_a40)) {
      if (CONCAT71(uStack_b8f,local_b90) != CONCAT71(uStack_b87,uStack_b88)) {
        if ((bStack_b80 == 0) || (uStack_a37._7_1_ == '\0')) goto LAB_0010c9e7;
        if (local_b78 != local_a28) goto LAB_0010c6c7;
      }
      boost::
      adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>
      ::
      adjacency_list<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,unsigned_long>*,std::vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>>>
                ((adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>
                  *)local_b28,local_b48,_Stack_b40,
                 (long)local_a80.super_type.m_vertices.
                       super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_a80.super_type.m_vertices.
                       super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 5,0,(no_property *)&local_b10);
      psVar1 = (pGVar6->super_type).m_vertices.
               super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
               ._M_impl.super__Vector_impl_data._M_start;
      psVar2 = (pGVar6->super_type).m_vertices.
               super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      local_b10.first.vEnd.m_value = (long)psVar2 - (long)psVar1 >> 5;
      if (psVar2 != psVar1) {
        ptVar9 = (type *)&(psVar1->super_StoredVertex).m_out_edges.
                          super__Vector_base<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
        local_b10.first.vCurr.m_value = 0;
        break;
      }
      vVar8 = 0;
      goto LAB_0010c7f3;
    }
LAB_0010c6c7:
    if ((bStack_b80 & 1) == 0) goto LAB_0010c9e7;
    local_b10.first.vBegin.m_value = local_b70;
    local_b20 = (undefined1 *)*local_b78;
    std::
    vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
    ::emplace_back<unsigned_long,unsigned_long>
              ((vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                *)&local_b48,(unsigned_long *)&local_b10,(unsigned_long *)&local_b20);
    if (bStack_b80 == 0) {
      __assert_fail("this->is_initialized()","/usr/include/boost/optional/optional.hpp",0x4c6,
                    "pointer_type boost::optional<std::pair<boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned long, EdgeProperties> *, std::vector<boost::detail::stored_edge_property<unsigned long, EdgeProperties>>>, unsigned long, boost::detail::edge_desc_impl<boost::directed_tag, unsigned long>, long>, boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned long, EdgeProperties> *, std::vector<boost::detail::stored_edge_property<unsigned long, EdgeProperties>>>, unsigned long, boost::detail::edge_desc_impl<boost::directed_tag, unsigned long>, long>>>::operator->() [T = std::pair<boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned long, EdgeProperties> *, std::vector<boost::detail::stored_edge_property<unsigned long, EdgeProperties>>>, unsigned long, boost::detail::edge_desc_impl<boost::directed_tag, unsigned long>, long>, boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned long, EdgeProperties> *, std::vector<boost::detail::stored_edge_property<unsigned long, EdgeProperties>>>, unsigned long, boost::detail::edge_desc_impl<boost::directed_tag, unsigned long>, long>>]"
                   );
    }
    local_b78 = local_b78 + 2;
    if (local_b78 == local_b68) {
      vVar8 = CONCAT71(uStack_b8f,local_b90);
      lVar10 = vVar8 * 0x20 + 0x28;
      do {
        if (CONCAT71(uStack_b87,uStack_b88) - 1U == vVar8) {
          local_b90 = uStack_b88;
          uStack_b8f = uStack_b87;
          goto LAB_0010c67b;
        }
        puVar3 = *(undefined8 **)(*(long *)(local_b58 + 0x18) + -8 + lVar10);
        puVar4 = *(undefined8 **)(*(long *)(local_b58 + 0x18) + lVar10);
        lVar10 = lVar10 + 0x20;
        vVar8 = vVar8 + 1;
      } while (puVar4 == puVar3);
      local_b90 = (undefined1)vVar8;
      uStack_b8f = (undefined7)(vVar8 >> 8);
      local_b78 = puVar3;
      local_b70 = vVar8;
      local_b68 = puVar4;
      local_b60 = vVar8;
    }
  } while( true );
  while( true ) {
    local_b10.first.vCurr.m_value = local_b10.first.vCurr.m_value + 1;
    ptVar9 = ptVar9 + 4;
    vVar8 = local_b10.first.vEnd.m_value;
    if (local_b10.first.vEnd.m_value == local_b10.first.vCurr.m_value) break;
    if (*ptVar9 != (type)((_Vector_impl_data *)(ptVar9 + -1))->_M_start) {
      local_b10.first.edges.super_type.m_initialized = true;
      local_b10.first.edges.super_type.m_storage.dummy_.aligner_ =
           (type)((_Vector_impl_data *)(ptVar9 + -1))->_M_start;
      local_b10.first.edges.super_type.m_storage.dummy_._8_8_ = local_b10.first.vCurr.m_value;
      local_b10.first.edges.super_type.m_storage.dummy_._16_8_ = *ptVar9;
      local_b10.first.edges.super_type.m_storage.dummy_._24_8_ = local_b10.first.vCurr.m_value;
      goto LAB_0010c85d;
    }
  }
LAB_0010c7f3:
  local_b10.first.edges.super_type.m_initialized = false;
  local_b10.first.vCurr.m_value = vVar8;
LAB_0010c85d:
  local_b10.first.vBegin.m_value = 0;
  local_b18 = &local_a48;
  local_b10.first.m_g = pGVar6;
  local_b10.second.vBegin.m_value = 0;
  local_b10.second.edges.super_type.m_initialized = false;
  local_b10.second.m_g = pGVar6;
  local_b20 = (undefined1 *)&uStack_b98;
  local_b10.second.vCurr.m_value = local_b10.first.vEnd.m_value;
  local_b10.second.vEnd.m_value = local_b10.first.vEnd.m_value;
  boost::tuples::
  tuple<boost::detail::adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>*,std::vector<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>,std::allocator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>>>>,unsigned_long,boost::detail::edge_desc_impl<boost::directed_tag,unsigned_long>,long>,boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>>&,boost::detail::adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>*,std::vector<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>,std::allocator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>>>>,unsigned_long,boost::detail::edge_desc_impl<boost::directed_tag,unsigned_long>,long>,boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>>&,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>
  ::operator=((tuple<boost::detail::adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>*,std::vector<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>,std::allocator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>>>>,unsigned_long,boost::detail::edge_desc_impl<boost::directed_tag,unsigned_long>,long>,boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>>&,boost::detail::adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>*,std::vector<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>,std::allocator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>>>>,unsigned_long,boost::detail::edge_desc_impl<boost::directed_tag,unsigned_long>,long>,boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>>&,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>
               *)&local_b20,&local_b10);
LAB_0010c8a0:
  do {
    if (CONCAT71(uStack_b8f,local_b90) == CONCAT71(uStack_a3f,local_a40)) {
      if (CONCAT71(uStack_b8f,local_b90) == CONCAT71(uStack_b87,uStack_b88)) {
LAB_0010c97a:
        if (local_b48._M_current != (pair<unsigned_long,_unsigned_long> *)0x0) {
          operator_delete(local_b48._M_current,local_b38 - (long)local_b48._M_current);
        }
        operator_delete(local_a80.m_property.px,1);
        std::
        vector<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
        ::~vector(&local_a80.super_type.m_vertices);
        while ((Graph *)local_a80.super_type.m_edges.
                        super__List_base<boost::list_edge<unsigned_long,_EdgeProperties>,_std::allocator<boost::list_edge<unsigned_long,_EdgeProperties>_>_>
                        ._M_impl._M_node.super__List_node_base._M_next != &local_a80) {
          pGVar5 = (Graph *)(((Graph *)
                             local_a80.super_type.m_edges.
                             super__List_base<boost::list_edge<unsigned_long,_EdgeProperties>,_std::allocator<boost::list_edge<unsigned_long,_EdgeProperties>_>_>
                             ._M_impl._M_node.super__List_node_base._M_next)->super_type).m_edges.
                            super__List_base<boost::list_edge<unsigned_long,_EdgeProperties>,_std::allocator<boost::list_edge<unsigned_long,_EdgeProperties>_>_>
                            ._M_impl._M_node.super__List_node_base._M_next;
          operator_delete(local_a80.super_type.m_edges.
                          super__List_base<boost::list_edge<unsigned_long,_EdgeProperties>,_std::allocator<boost::list_edge<unsigned_long,_EdgeProperties>_>_>
                          ._M_impl._M_node.super__List_node_base._M_next,0x28);
          local_a80.super_type.m_edges.
          super__List_base<boost::list_edge<unsigned_long,_EdgeProperties>,_std::allocator<boost::list_edge<unsigned_long,_EdgeProperties>_>_>
          ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)pGVar5;
        }
        return pGVar6;
      }
      if ((bStack_b80 == 0) || (uStack_a37._7_1_ == '\0')) {
LAB_0010c9e7:
        __assert_fail("this->is_initialized()","/usr/include/boost/optional/optional.hpp",0x4c5,
                      "pointer_const_type boost::optional<std::pair<boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned long, EdgeProperties> *, std::vector<boost::detail::stored_edge_property<unsigned long, EdgeProperties>>>, unsigned long, boost::detail::edge_desc_impl<boost::directed_tag, unsigned long>, long>, boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned long, EdgeProperties> *, std::vector<boost::detail::stored_edge_property<unsigned long, EdgeProperties>>>, unsigned long, boost::detail::edge_desc_impl<boost::directed_tag, unsigned long>, long>>>::operator->() const [T = std::pair<boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned long, EdgeProperties> *, std::vector<boost::detail::stored_edge_property<unsigned long, EdgeProperties>>>, unsigned long, boost::detail::edge_desc_impl<boost::directed_tag, unsigned long>, long>, boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned long, EdgeProperties> *, std::vector<boost::detail::stored_edge_property<unsigned long, EdgeProperties>>>, unsigned long, boost::detail::edge_desc_impl<boost::directed_tag, unsigned long>, long>>]"
                     );
      }
      if (local_b78 == local_a28) goto LAB_0010c97a;
    }
    iVar7 = randomRange(cost_min,cost_max);
    if (bStack_b80 == 0) goto LAB_0010c9e7;
    *(int *)local_b78[1] = iVar7;
    local_b78 = local_b78 + 2;
    if (local_b78 == local_b68) {
      vVar8 = CONCAT71(uStack_b8f,local_b90);
      lVar10 = vVar8 * 0x20 + 0x28;
      do {
        if (CONCAT71(uStack_b87,uStack_b88) - 1U == vVar8) {
          local_b90 = uStack_b88;
          uStack_b8f = uStack_b87;
          goto LAB_0010c8a0;
        }
        puVar3 = *(undefined8 **)(*(long *)(local_b58 + 0x18) + -8 + lVar10);
        puVar4 = *(undefined8 **)(*(long *)(local_b58 + 0x18) + lVar10);
        lVar10 = lVar10 + 0x20;
        vVar8 = vVar8 + 1;
      } while (puVar4 == puVar3);
      local_b90 = (undefined1)vVar8;
      uStack_b8f = (undefined7)(vVar8 >> 8);
      local_b78 = puVar3;
      local_b70 = vVar8;
      local_b68 = puVar4;
      local_b60 = vVar8;
    }
  } while( true );
}

Assistant:

Graph createRandomGraph(unsigned long verices, unsigned long edges, int cost_min, int cost_max)
{
    Graph G;
    EdgeIterator ei, ei_end;

    // Generating Random connected graph
    boost::mt19937 gen;
    generate_random_graph(G, verices, edges, gen, false, false);
    boost::make_connected<Graph>(G);

    // Converting to EdgeList graph
    std::vector<std::pair<Graph::vertex_descriptor, Graph::vertex_descriptor> > pairlist;
    for (boost::tie(ei, ei_end) = boost::edges(G); ei!=ei_end; ++ei) {
        pairlist.emplace_back(source(*ei, G), target(*ei, G));
    }
    Graph g(pairlist.begin(), pairlist.end(), num_vertices(G));

    // Adding weights
    for(boost::tie(ei, ei_end) = boost::edges(g); ei != ei_end; ++ei) {
        g[*ei].weight = randomRange(cost_min, cost_max);
    }

    return g;
}